

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnTableSize(SharedValidator *this,Location *loc,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  TableType tt;
  TableType TStack_98;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0xd9,loc);
  TStack_98.limits.max._0_3_ = 0;
  TStack_98.limits._11_8_ = 0;
  TStack_98.element.enum_ = Any;
  TStack_98.element.type_index_ = 0;
  TStack_98.limits.initial._0_3_ = 0;
  TStack_98.limits.initial._3_5_ = 0;
  Var::Var(&local_70,table_var);
  RVar2 = CheckTableIndex(this,&local_70,&TStack_98);
  Var::~Var(&local_70);
  RVar3 = TypeChecker::OnTableSize(&this->typechecker_,&TStack_98.limits);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableSize(const Location& loc, Var table_var) {
  Result result = CheckInstr(Opcode::TableSize, loc);
  TableType tt;
  result |= CheckTableIndex(table_var, &tt);
  result |= typechecker_.OnTableSize(tt.limits);
  return result;
}